

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RealSpaceTest.cpp
# Opt level: O1

void __thiscall RealPointDiff::test_method(RealPointDiff *this)

{
  void *__ptr;
  undefined8 uVar1;
  sp_counted_base *psVar2;
  bool bVar3;
  MatrixXd J;
  VectorXd x;
  RealSpace R7;
  void *local_240;
  undefined8 local_238;
  shared_count sStack_230;
  void *local_228;
  undefined8 uStack_220;
  sp_counted_base *local_218;
  void *local_210;
  ulong local_208;
  RealScalar local_200;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  char *local_1c8;
  char *local_1c0;
  undefined **local_1b8;
  void *pvStack_1b0;
  undefined8 *local_1a8;
  char **local_1a0;
  undefined8 uStack_198;
  code *local_88 [11];
  void *local_30;
  void *local_20;
  
  mnf::RealSpace::RealSpace((RealSpace *)local_88,7);
  local_228 = (void *)0x0;
  uStack_220 = 0;
  local_218 = (sp_counted_base *)0x0;
  mnf::Manifold::createPoint();
  mnf::SubPoint::value();
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_210,
             (DenseBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
              *)&local_240);
  mnf::ConstSubPoint::~ConstSubPoint((ConstSubPoint *)&local_1a0);
  free(pvStack_1b0);
  local_1a0 = (char **)0x0;
  uStack_198 = 0;
  local_1b8 = (undefined **)local_210;
  pvStack_1b0 = (void *)local_208;
  if (-1 < (long)local_208 || local_210 == (void *)0x0) {
    mnf::Manifold::diffRetractation((Ref_conflict *)&local_240);
    psVar2 = local_218;
    uVar1 = uStack_220;
    __ptr = local_228;
    local_228 = local_240;
    local_240 = __ptr;
    uStack_220 = local_238;
    local_218 = sStack_230.pi_;
    local_238 = uVar1;
    sStack_230.pi_ = psVar2;
    free(__ptr);
    free(local_1a0);
    local_1c8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/RealSpaceTest.cpp"
    ;
    local_1c0 = "";
    local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1c8,0x8c);
    local_200 = 1e-12;
    bVar3 = Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::isIdentity
                      ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_228,
                       &local_200);
    local_240 = (void *)CONCAT71(local_240._1_7_,bVar3);
    local_238 = 0;
    sStack_230.pi_ = (sp_counted_base *)0x0;
    local_1a0 = &local_1e8;
    local_1e8 = "J.isIdentity()";
    local_1e0 = "";
    pvStack_1b0 = (void *)((ulong)pvStack_1b0 & 0xffffffffffffff00);
    local_1b8 = &PTR__lazy_ostream_0012bc88;
    local_1a8 = &boost::unit_test::lazy_ostream::inst;
    local_1f8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/RealSpaceTest.cpp"
    ;
    local_1f0 = "";
    boost::test_tools::tt_detail::report_assertion();
    boost::detail::shared_count::~shared_count(&sStack_230);
    free(local_210);
    free(local_228);
    local_88[0] = std::terminate;
    free(local_20);
    free(local_30);
    mnf::Manifold::~Manifold((Manifold *)local_88);
    return;
  }
  __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                "Eigen::MapBase<Eigen::Ref<const Eigen::Matrix<double, -1, 1>>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<const Eigen::Matrix<double, -1, 1>>, Level = 0]"
               );
}

Assistant:

BOOST_AUTO_TEST_CASE(RealPointDiff)
{
  RealSpace R7(7);
  Eigen::MatrixXd J;
  Eigen::VectorXd x = R7.createPoint().value();
  J = R7.diffRetractation(x);
  BOOST_CHECK(J.isIdentity());
}